

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N)

{
  int iVar1;
  u32 uVar2;
  u32 iChild;
  u8 *p;
  ulong uVar3;
  bool bVar4;
  Pgno iFreePage;
  int n;
  uchar *pOvflData;
  DbPage *pOvflPage;
  int iFirst;
  int expected;
  int i;
  int N_local;
  int iPage_local;
  int isFreeList_local;
  IntegrityCk *pCheck_local;
  
  pOvflPage._0_4_ = iPage;
  pOvflPage._4_4_ = N;
  expected = N;
  i = iPage;
  N_local = isFreeList;
  _iPage_local = pCheck;
  while( true ) {
    bVar4 = false;
    if (0 < expected) {
      bVar4 = _iPage_local->mxErr != 0;
    }
    if (!bVar4) {
      return;
    }
    if (i < 1) {
      uVar3 = (ulong)(uint)expected;
      expected = expected + -1;
      checkAppendMsg(_iPage_local,"%d of %d pages missing from overflow list starting at %d",uVar3,
                     (ulong)pOvflPage._4_4_,(ulong)(uint)pOvflPage);
      return;
    }
    expected = expected + -1;
    iVar1 = checkRef(_iPage_local,i);
    if (iVar1 != 0) break;
    iVar1 = sqlite3PagerGet(_iPage_local->pPager,i,(DbPage **)&pOvflData,0);
    if (iVar1 != 0) {
      checkAppendMsg(_iPage_local,"failed to get page %d",(ulong)(uint)i);
      return;
    }
    p = (u8 *)sqlite3PagerGetData((DbPage *)pOvflData);
    if (N_local == 0) {
      if ((_iPage_local->pBt->autoVacuum != '\0') && (0 < expected)) {
        iFirst = sqlite3Get4byte(p);
        checkPtrmap(_iPage_local,iFirst,'\x04',i);
      }
    }
    else {
      uVar2 = sqlite3Get4byte(p + 4);
      if (_iPage_local->pBt->autoVacuum != '\0') {
        checkPtrmap(_iPage_local,i,'\x02',0);
      }
      if ((int)_iPage_local->pBt->usableSize / 4 + -2 < (int)uVar2) {
        checkAppendMsg(_iPage_local,"freelist leaf count too big on page %d",(ulong)(uint)i);
        expected = expected + -1;
      }
      else {
        for (iFirst = 0; iFirst < (int)uVar2; iFirst = iFirst + 1) {
          iChild = sqlite3Get4byte(p + (iFirst * 4 + 8));
          if (_iPage_local->pBt->autoVacuum != '\0') {
            checkPtrmap(_iPage_local,iChild,'\x02',0);
          }
          checkRef(_iPage_local,iChild);
        }
        expected = expected - uVar2;
      }
    }
    i = sqlite3Get4byte(p);
    sqlite3PagerUnref((DbPage *)pOvflData);
    if ((N_local != 0) && (expected < (int)(uint)(i != 0))) {
      checkAppendMsg(_iPage_local,"free-page count in header is too small");
    }
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N                 /* Expected number of pages in the list */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);

    if( isFreeList && N<(iPage!=0) ){
      checkAppendMsg(pCheck, "free-page count in header is too small");
    }
  }
}